

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O2

bool __thiscall SNMPTrap::setInform(SNMPTrap *this,bool inf)

{
  SNMP_VERSION SVar1;
  ASN_TYPE responseType;
  
  this->inform = inf;
  SVar1 = (this->super_SNMPPacket).snmpVersion;
  if (SVar1 == SNMP_VERSION_2C) {
    responseType = inf ^ Trapv2PDU;
  }
  else if (SVar1 == SNMP_VERSION_1) {
    responseType = TrapPDU;
  }
  else {
    responseType = (this->super_SNMPPacket).packetPDUType;
  }
  SNMPPacket::setPDUType(&this->super_SNMPPacket,responseType);
  return true;
}

Assistant:

bool setInform(bool inf){
        this->inform = inf;
        ASN_TYPE pduType = this->packetPDUType;
        switch(this->snmpVersion){
            case SNMP_VERSION_1:
                pduType = TrapPDU;
            break;
            case SNMP_VERSION_2C:
                pduType = this->inform ? InformRequestPDU : Trapv2PDU;
            break;
            default:
            break;
        }
        this->setPDUType(pduType);
        return true;
    }